

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

int __thiscall
leveldb::MemTable::KeyComparator::operator()(KeyComparator *this,char *aptr,char *bptr)

{
  int iVar1;
  undefined1 local_40 [8];
  Slice b;
  Slice a;
  char *bptr_local;
  char *aptr_local;
  KeyComparator *this_local;
  
  join_0x00000010_0x00000000_ = GetLengthPrefixedSlice(aptr);
  _local_40 = GetLengthPrefixedSlice(bptr);
  iVar1 = InternalKeyComparator::Compare(&this->comparator,(Slice *)&b.size_,(Slice *)local_40);
  return iVar1;
}

Assistant:

int MemTable::KeyComparator::operator()(const char *aptr, const char *bptr)
    const {
        // Internal keys are encoded as length-prefixed strings.
        Slice a = GetLengthPrefixedSlice(aptr);
        Slice b = GetLengthPrefixedSlice(bptr);
        return comparator.Compare(a, b);
    }